

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall
Transaction_CommitAfterAppending4Mb_Test::~Transaction_CommitAfterAppending4Mb_Test
          (Transaction_CommitAfterAppending4Mb_Test *this)

{
  Transaction_CommitAfterAppending4Mb_Test *this_local;
  
  ~Transaction_CommitAfterAppending4Mb_Test(this);
  operator_delete(this,0x1e0);
  return;
}

Assistant:

TEST_F (Transaction, CommitAfterAppending4Mb) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
    {
        mock_mutex mutex;
        auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});

        std::size_t const elements = (4U * 1024U * 1024U) / sizeof (int);
        transaction.allocate (elements * sizeof (int), 1 /*align*/);
        transaction.commit ();
    }

    // Check the two footers.
    {
        pstore::header const * const header = this->get_header ();
        pstore::typed_address<pstore::trailer> const r1_footer_offset = header->footer_pos;

        auto r1_footer = reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () +
                                                                    r1_footer_offset.absolute ());
        EXPECT_THAT (pstore::trailer::default_signature1,
                     ::testing::ContainerEq (r1_footer->a.signature1))
            << "Did not find r1 footer signature1";
        EXPECT_EQ (1U, r1_footer->a.generation) << "r1 footer generation number must be 1";
        EXPECT_EQ (4194304U, r1_footer->a.size);
        EXPECT_THAT (pstore::trailer::default_signature2,
                     ::testing::ContainerEq (r1_footer->signature2))
            << "Did not find r1 footer signature2";

        pstore::typed_address<pstore::trailer> const r0_footer_offset =
            r1_footer->a.prev_generation;

        auto r0_footer = reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () +
                                                                    r0_footer_offset.absolute ());
        EXPECT_THAT (pstore::trailer::default_signature1,
                     ::testing::ContainerEq (r0_footer->a.signature1))
            << "Did not find r0 footer signature1";
        EXPECT_EQ (0U, r0_footer->a.generation) << "r0 footer generation number must be 0";
        EXPECT_EQ (0U, r0_footer->a.size) << "expected the r0 footer size value to be 0";
        EXPECT_EQ (pstore::typed_address<pstore::trailer>::null (), r0_footer->a.prev_generation)
            << "The r0 footer should not point to a previous generation";
        EXPECT_THAT (pstore::trailer::default_signature2,
                     ::testing::ContainerEq (r0_footer->signature2))
            << "Did not find r0 footer signature2";

        EXPECT_GE (r1_footer->a.time, r0_footer->a.time)
            << "r1 time must not be earlier than r0 time";
    }
}